

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O0

void test_for_append(bsdtar *bsdtar)

{
  int iVar1;
  undefined1 local_a0 [8];
  stat s;
  bsdtar *bsdtar_local;
  
  s.__glibc_reserved[2] = (__syscall_slong_t)bsdtar;
  if ((*bsdtar->argv == (char *)0x0) && (bsdtar->names_from_file == (char *)0x0)) {
    lafe_errc(1,0,"no files or directories specified");
  }
  if (bsdtar->filename == (char *)0x0) {
    lafe_errc(1,0,"Cannot append to stdout.");
  }
  iVar1 = stat(bsdtar->filename,(stat *)local_a0);
  if (((iVar1 == 0) && (((uint)s.st_nlink & 0xf000) != 0x8000)) &&
     (((uint)s.st_nlink & 0xf000) != 0x6000)) {
    lafe_errc(1,0,"Cannot append to %s: not a regular file.",*(undefined8 *)s.__glibc_reserved[2]);
  }
  return;
}

Assistant:

static void
test_for_append(struct bsdtar *bsdtar)
{
	struct stat s;

	if (*bsdtar->argv == NULL && bsdtar->names_from_file == NULL)
		lafe_errc(1, 0, "no files or directories specified");
	if (bsdtar->filename == NULL)
		lafe_errc(1, 0, "Cannot append to stdout.");

	if (stat(bsdtar->filename, &s) != 0)
		return;

	if (!S_ISREG(s.st_mode) && !S_ISBLK(s.st_mode))
		lafe_errc(1, 0,
		    "Cannot append to %s: not a regular file.",
		    bsdtar->filename);

/* Is this an appropriate check here on Windows? */
/*
	if (GetFileType(handle) != FILE_TYPE_DISK)
		lafe_errc(1, 0, "Cannot append");
*/

}